

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec_random.cpp
# Opt level: O2

result_type_conflict __thiscall SecRandom::operator()(SecRandom *this)

{
  ssize_t sVar1;
  int *piVar2;
  size_t __nbytes;
  result_type_conflict *__buf;
  result_type_conflict r;
  
  __nbytes = 1;
  __buf = &r;
  do {
    while( true ) {
      if (__nbytes == 0) {
        return r;
      }
      sVar1 = read(this->fd_,__buf,__nbytes);
      if (sVar1 == -1) break;
      if (sVar1 == 0) goto LAB_00102646;
      __nbytes = __nbytes - sVar1;
      __buf = __buf + sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  anon_unknown.dwarf_4ecb::__throw_system_error(*piVar2,"random_device got an unexpected error");
LAB_00102646:
  anon_unknown.dwarf_4ecb::__throw_system_error(0x3d,"random_device got EOF");
  __cxa_begin_catch();
  std::terminate();
}

Assistant:

SecRandom::result_type SecRandom::operator()()
{
  result_type r;
  size_t n = sizeof(r);
  char* p = reinterpret_cast<char*>(&r);
  while (n > 0)
  {
    ssize_t s = read(fd_, p, n);
    if (s == 0)
      __throw_system_error(ENODATA, "random_device got EOF");
    if (s == -1) 
    {   
      if (errno != EINTR)
        __throw_system_error(errno, "random_device got an unexpected error");
      continue;
    }   
    n -= static_cast<size_t>(s);
    p += static_cast<size_t>(s);
  }
  return r;
}